

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectricityBill.cpp
# Opt level: O0

void __thiscall ElectricityBill::AddNewRoom(ElectricityBill *this,RoomInfo *room_info)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  RoomInfo *local_18;
  RoomInfo *room_info_local;
  ElectricityBill *this_local;
  
  local_18 = room_info;
  room_info_local = (RoomInfo *)this;
  std::vector<RoomInfo,_std::allocator<RoomInfo>_>::push_back(&this->room_informations_,room_info);
  std::operator+(&local_38,&local_18->flatname,"\n");
  higan::FileForAppend::Append(&this->room_file_,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::operator+(&local_68,&local_18->roomname,"\n");
  higan::FileForAppend::Append(&this->room_file_,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  higan::FileForAppend::Flush(&this->room_file_);
  return;
}

Assistant:

void ElectricityBill::AddNewRoom(const RoomInfo& room_info)
{
	room_informations_.push_back(room_info);

	room_file_.Append(room_info.flatname + "\n");
	room_file_.Append(room_info.roomname + "\n");
	room_file_.Flush();
}